

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_registry.c
# Opt level: O0

_Bool upb_ExtensionRegistry_AddAllLinkedExtensions(upb_ExtensionRegistry *r)

{
  _Bool _Var1;
  uint32_t uVar2;
  upb_MiniTableExtension *local_30;
  upb_MiniTableExtension *p;
  upb_MiniTableExtension *stop;
  upb_MiniTableExtension *start;
  upb_ExtensionRegistry *r_local;
  
  local_30 = UPB_linkarr_internal_empty_upb_AllExts;
  while( true ) {
    if ((upb_MiniTableExtension *)
        ((long)&UPB_linkarr_internal_empty_upb_AllExts[0].sub_dont_copy_me__upb_internal_use_only +
        7) < local_30) {
      return true;
    }
    uVar2 = upb_MiniTableExtension_Number(local_30);
    if ((uVar2 != 0) && (_Var1 = upb_ExtensionRegistry_Add(r,local_30), !_Var1)) break;
    local_30 = local_30 + 1;
  }
  return false;
}

Assistant:

bool upb_ExtensionRegistry_AddAllLinkedExtensions(upb_ExtensionRegistry* r) {
  const upb_MiniTableExtension* start = UPB_LINKARR_START(upb_AllExts);
  const upb_MiniTableExtension* stop = UPB_LINKARR_STOP(upb_AllExts);
  for (const upb_MiniTableExtension* p = start; p < stop; p++) {
    // Windows can introduce zero padding, so we have to skip zeroes.
    if (upb_MiniTableExtension_Number(p) != 0) {
      if (!upb_ExtensionRegistry_Add(r, p)) return false;
    }
  }
  return true;
}